

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O1

size_t HUF_readCTable(HUF_CElt *CTable,uint *maxSymbolValuePtr,void *src,size_t srcSize,
                     uint *hasZeroWeights)

{
  int iVar1;
  ushort uVar2;
  U32 curr;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  U32 UVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  byte bVar11;
  HUF_CElt *elt;
  U32 nbSymbols;
  U32 tableLog;
  U16 valPerRank [14];
  U16 nbPerRank [14];
  U32 rankVal [13];
  BYTE huffWeight [256];
  U32 local_1b0;
  U32 local_1ac;
  ushort auStack_1a8 [16];
  short asStack_188 [16];
  U32 local_168;
  int aiStack_164 [15];
  BYTE local_128 [264];
  
  local_1ac = 0;
  local_1b0 = 0;
  sVar4 = HUF_readStats(local_128,0x100,&local_168,&local_1b0,&local_1ac,src,srcSize);
  sVar5 = sVar4;
  if (sVar4 < 0xffffffffffffff89) {
    *hasZeroWeights = (uint)(local_168 != 0);
    uVar8 = (ulong)local_1ac;
    sVar5 = 0xffffffffffffffd4;
    if (uVar8 < 0xd) {
      uVar9 = (ulong)local_1b0;
      sVar5 = 0xffffffffffffffd0;
      if (local_1b0 <= *maxSymbolValuePtr + 1) {
        *CTable = uVar8;
        if (local_1ac != 0) {
          uVar7 = 0;
          iVar3 = 0;
          do {
            iVar1 = aiStack_164[uVar7];
            bVar11 = (byte)uVar7;
            aiStack_164[uVar7] = iVar3;
            uVar7 = uVar7 + 1;
            iVar3 = (iVar1 << (bVar11 & 0x1f)) + iVar3;
          } while (uVar8 != uVar7);
        }
        elt = CTable + 1;
        if (uVar9 != 0) {
          lVar10 = 0;
          do {
            bVar11 = ((char)local_1ac + '\x01') - local_128[lVar10];
            if (local_128[lVar10] == '\0') {
              bVar11 = 0;
            }
            if (0xc < bVar11) {
              __assert_fail("nbBits <= HUF_TABLELOG_ABSOLUTEMAX",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                            ,0xd2,"void HUF_setNbBits(HUF_CElt *, size_t)");
            }
            elt[lVar10] = (ulong)bVar11;
            lVar10 = lVar10 + 1;
          } while (local_1b0 != (uint)lVar10);
        }
        asStack_188[8] = 0;
        asStack_188[9] = 0;
        asStack_188[10] = 0;
        asStack_188[0xb] = 0;
        asStack_188[0xc] = 0;
        asStack_188[0xd] = 0;
        asStack_188[0] = 0;
        asStack_188[1] = 0;
        asStack_188[2] = 0;
        asStack_188[3] = 0;
        asStack_188[4] = 0;
        asStack_188[5] = 0;
        asStack_188[6] = 0;
        asStack_188[7] = 0;
        auStack_1a8[8] = 0;
        auStack_1a8[9] = 0;
        auStack_1a8[10] = 0;
        auStack_1a8[0xb] = 0;
        auStack_1a8[0xc] = 0;
        auStack_1a8[0xd] = 0;
        auStack_1a8[0] = 0;
        auStack_1a8[1] = 0;
        auStack_1a8[2] = 0;
        auStack_1a8[3] = 0;
        auStack_1a8[4] = 0;
        auStack_1a8[5] = 0;
        auStack_1a8[6] = 0;
        auStack_1a8[7] = 0;
        if (uVar9 != 0) {
          uVar7 = 0;
          do {
            asStack_188[(byte)elt[uVar7]] = asStack_188[(byte)elt[uVar7]] + 1;
            uVar7 = uVar7 + 1;
          } while (uVar9 != uVar7);
        }
        auStack_1a8[uVar8 + 1] = 0;
        if (local_1ac != 0) {
          uVar2 = 0;
          UVar6 = local_1ac;
          do {
            auStack_1a8[uVar8] = uVar2;
            uVar2 = (ushort)(uVar2 + asStack_188[uVar8]) >> 1;
            uVar8 = uVar8 - 1;
            UVar6 = UVar6 - 1;
          } while (UVar6 != 0);
        }
        if (local_1b0 != 0) {
          uVar8 = 0;
          do {
            uVar2 = auStack_1a8[(byte)*elt];
            auStack_1a8[(byte)*elt] = uVar2 + 1;
            HUF_setValue(elt,(ulong)uVar2);
            uVar8 = uVar8 + 1;
            elt = elt + 1;
          } while (uVar8 < local_1b0);
        }
        *maxSymbolValuePtr = local_1b0 - 1;
        sVar5 = sVar4;
      }
    }
  }
  return sVar5;
}

Assistant:

size_t HUF_readCTable (HUF_CElt* CTable, unsigned* maxSymbolValuePtr, const void* src, size_t srcSize, unsigned* hasZeroWeights)
{
    BYTE huffWeight[HUF_SYMBOLVALUE_MAX + 1];   /* init not required, even though some static analyzer may complain */
    U32 rankVal[HUF_TABLELOG_ABSOLUTEMAX + 1];   /* large enough for values from 0 to 16 */
    U32 tableLog = 0;
    U32 nbSymbols = 0;
    HUF_CElt* const ct = CTable + 1;

    /* get symbol weights */
    CHECK_V_F(readSize, HUF_readStats(huffWeight, HUF_SYMBOLVALUE_MAX+1, rankVal, &nbSymbols, &tableLog, src, srcSize));
    *hasZeroWeights = (rankVal[0] > 0);

    /* check result */
    if (tableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (nbSymbols > *maxSymbolValuePtr+1) return ERROR(maxSymbolValue_tooSmall);

    CTable[0] = tableLog;

    /* Prepare base value per rank */
    {   U32 n, nextRankStart = 0;
        for (n=1; n<=tableLog; n++) {
            U32 curr = nextRankStart;
            nextRankStart += (rankVal[n] << (n-1));
            rankVal[n] = curr;
    }   }

    /* fill nbBits */
    {   U32 n; for (n=0; n<nbSymbols; n++) {
            const U32 w = huffWeight[n];
            HUF_setNbBits(ct + n, (BYTE)(tableLog + 1 - w) & -(w != 0));
    }   }

    /* fill val */
    {   U16 nbPerRank[HUF_TABLELOG_MAX+2]  = {0};  /* support w=0=>n=tableLog+1 */
        U16 valPerRank[HUF_TABLELOG_MAX+2] = {0};
        { U32 n; for (n=0; n<nbSymbols; n++) nbPerRank[HUF_getNbBits(ct[n])]++; }
        /* determine stating value per rank */
        valPerRank[tableLog+1] = 0;   /* for w==0 */
        {   U16 min = 0;
            U32 n; for (n=tableLog; n>0; n--) {  /* start at n=tablelog <-> w=1 */
                valPerRank[n] = min;     /* get starting value within each rank */
                min += nbPerRank[n];
                min >>= 1;
        }   }
        /* assign value within rank, symbol order */
        { U32 n; for (n=0; n<nbSymbols; n++) HUF_setValue(ct + n, valPerRank[HUF_getNbBits(ct[n])]++); }
    }

    *maxSymbolValuePtr = nbSymbols - 1;
    return readSize;
}